

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O2

s_level * get_first_elemental_plane(void)

{
  s_level *psVar1;
  s_level *psVar2;
  s_level *psVar3;
  
  psVar1 = find_level("dummy");
  psVar2 = find_level("astral");
  do {
    psVar3 = psVar2;
    if (psVar2 == (s_level *)0x0) {
      return psVar3;
    }
    psVar2 = psVar2->next;
  } while (psVar2 != psVar1);
  return psVar3;
}

Assistant:

s_level *get_first_elemental_plane(void)
{
	s_level *curr,
		*dummy = find_level("dummy");
	for (curr = find_level("astral"); curr; curr = curr->next) {
	    if (curr->next == dummy)
		return curr;
	}
	return NULL;
}